

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall
asmjit::RALocalAllocator::spillAfterAllocation(RALocalAllocator *this,InstNode *node)

{
  uint32_t **ppuVar1;
  uint32_t **ppuVar2;
  byte bVar3;
  long lVar4;
  BaseNode *node_00;
  WorkToPhysMap *pWVar5;
  PhysToWorkMap *pPVar6;
  PhysToWorkMap *pPVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  Error EVar10;
  uint uVar11;
  uint32_t *puVar12;
  BaseNode *pBVar13;
  Operand_ *pOVar14;
  void *pvVar15;
  RABlock *block;
  long lVar16;
  ulong unaff_RBP;
  InstNode *node_01;
  BaseCompiler *pBVar17;
  RALocalAllocator *this_00;
  ulong unaff_R12;
  uint uVar18;
  ulong unaff_R13;
  InstNode *pIVar19;
  uint32_t uStack_b0;
  uint32_t uStack_ac;
  uint32_t uStack_a8;
  uint32_t uStack_a4;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  long lStack_88;
  ulong uStack_80;
  ulong uStack_78;
  RALocalAllocator *pRStack_70;
  InstNode *pIStack_68;
  code *pcStack_60;
  RALocalAllocator *local_50;
  InstNode *local_48;
  void *local_40;
  InstNode *local_38;
  
  pvVar15 = (node->super_BaseNode)._passData;
  node_01 = (InstNode *)(ulong)*(uint *)((long)pvVar15 + 0xc);
  if (node_01 != (InstNode *)0x0) {
    local_50 = (RALocalAllocator *)&this->_curAssignment;
    lVar16 = (long)pvVar15 + 0x4c;
    pIVar19 = (InstNode *)0x0;
    this_00 = this;
    local_48 = node_01;
    local_40 = pvVar15;
    local_38 = node;
    do {
      if ((InstNode *)(ulong)*(uint *)((long)pvVar15 + 0xc) <= pIVar19) {
        pcStack_60 = (code *)0x11cb0a;
        spillAfterAllocation();
LAB_0011cb0a:
        pcStack_60 = (code *)0x11cb0f;
        spillAfterAllocation();
LAB_0011cb0f:
        pcStack_60 = (code *)0x11cb14;
        spillAfterAllocation();
LAB_0011cb14:
        pcStack_60 = (code *)0x11cb19;
        spillAfterAllocation();
LAB_0011cb19:
        pcStack_60 = allocBranch;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = (node_01->super_BaseNode).field_0.field_0._prev;
        lStack_88 = lVar16;
        uStack_80 = unaff_R12;
        uStack_78 = unaff_R13;
        pRStack_70 = this;
        pIStack_68 = pIVar19;
        pcStack_60 = (code *)unaff_RBP;
        if ((block->_entryPhysToWorkMap != (PhysToWorkMap *)0x0) &&
           (EVar10 = switchToAssignment(this_00,block->_entryPhysToWorkMap,
                                        block->_entryWorkToPhysMap,block->_liveBits,
                                        SUB41((block->_flags & 8) >> 3,0),true), EVar10 != 0)) {
          return EVar10;
        }
        EVar10 = allocInst(this_00,node_01);
        if (EVar10 != 0) {
          return EVar10;
        }
        uVar11 = block->_sharedAssignmentId;
        if ((ulong)uVar11 == 0xffffffff) {
          puVar12 = &block->_entryScratchGpRegs;
LAB_0011cbbf:
          EVar10 = spillScratchGpRegsBeforeEntry(this_00,*puVar12);
          if (EVar10 != 0) {
            return EVar10;
          }
          if (block->_entryPhysToWorkMap == (PhysToWorkMap *)0x0) {
            EVar10 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar10 != 0) {
              return EVar10;
            }
          }
          else {
            node_00 = (this_00->_pass->_extraBlock->field_0).field_0._prev;
            pBVar13 = BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,node_00);
            pWVar5 = (this_00->_curAssignment)._workToPhysMap;
            memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap
                   ,(ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
            memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar5,
                   (ulong)(this_00->_tmpAssignment)._layout.workCount);
            EVar10 = switchToAssignment(this_00,block->_entryPhysToWorkMap,
                                        block->_entryWorkToPhysMap,block->_liveBits,
                                        SUB41((block->_flags & 8) >> 3,0),false);
            if (EVar10 != 0) {
              return EVar10;
            }
            pBVar17 = this_00->_cc;
            if ((pBVar17->super_BaseBuilder)._cursor != node_00) {
              uVar11 = (node_01->super_BaseNode).field_1._any._reserved0 - 1;
              if ((node_01->super_BaseNode).field_1._any._reserved1 <= uVar11) goto LAB_0011cd6a;
              if ((node_01->_opArray[uVar11]._signature & 7) != 4) goto LAB_0011cd6f;
              (*(pBVar17->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_b0);
              pOVar14 = node_01->_opArray + uVar11;
              uStack_a0._0_4_ = pOVar14->_signature;
              uStack_a0._4_4_ = pOVar14->_baseId;
              uStack_98 = *(undefined8 *)node_01->_opArray[uVar11]._data;
              pOVar14->_signature = uStack_b0;
              node_01->_opArray[uVar11]._baseId = uStack_ac;
              node_01->_opArray[uVar11]._data[0] = uStack_a8;
              node_01->_opArray[uVar11]._data[1] = uStack_a4;
              puVar12 = &(node_01->_baseInst)._options;
              *(byte *)puVar12 = (byte)*puVar12 & 0xef;
              EVar10 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
              if (EVar10 != 0) {
                return EVar10;
              }
              pBVar17 = this_00->_cc;
              (pBVar17->super_BaseBuilder)._cursor = node_00;
              (*(pBVar17->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar17,&uStack_b0);
              pBVar17 = this_00->_cc;
            }
            (pBVar17->super_BaseBuilder)._cursor = pBVar13;
            pWVar5 = (this_00->_curAssignment)._workToPhysMap;
            pPVar6 = (this_00->_curAssignment)._physToWorkMap;
            pPVar7 = (this_00->_tmpAssignment)._physToWorkMap;
            (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
            (this_00->_curAssignment)._physToWorkMap = pPVar7;
            (this_00->_tmpAssignment)._workToPhysMap = pWVar5;
            (this_00->_tmpAssignment)._physToWorkMap = pPVar6;
            lVar16 = 0;
            do {
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds + lVar16;
              puVar12 = *ppuVar1;
              puVar8 = ppuVar1[1];
              ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds + lVar16;
              puVar9 = ppuVar2[1];
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds + lVar16;
              *ppuVar1 = *ppuVar2;
              ppuVar1[1] = puVar9;
              ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds + lVar16;
              *ppuVar1 = puVar12;
              ppuVar1[1] = puVar8;
              lVar16 = lVar16 + 2;
            } while (lVar16 != 4);
          }
          EVar10 = 0;
        }
        else {
          if (uVar11 < (block->_ra->_sharedAssignments).super_ZoneVectorBase._size) {
            puVar12 = (uint32_t *)
                      ((ulong)uVar11 * 0x28 +
                      (long)(block->_ra->_sharedAssignments).super_ZoneVectorBase._data);
            goto LAB_0011cbbf;
          }
          allocBranch();
LAB_0011cd6a:
          allocBranch();
LAB_0011cd6f:
          EVar10 = 3;
        }
        return EVar10;
      }
      if ((*(byte *)(lVar16 + 2) & 2) != 0) {
        uVar11 = *(uint *)(lVar16 + -4);
        unaff_R12 = (ulong)uVar11;
        if ((this->_pass->_workRegs).super_ZoneVectorBase._size <= uVar11) goto LAB_0011cb0a;
        lVar4 = *(long *)((long)(this->_pass->_workRegs).super_ZoneVectorBase._data + unaff_R12 * 8)
        ;
        if (*(char *)(lVar4 + 0x3a) != -1) goto LAB_0011cae4;
        if ((this->_curAssignment)._layout.workCount <= uVar11) goto LAB_0011cb0f;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_RBP = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_0011cae4;
        uVar18 = *(uint *)(lVar4 + 0x20);
        unaff_R13 = (ulong)uVar18;
        (this->_cc->super_BaseBuilder)._cursor = &local_38->super_BaseNode;
        if (0x1f < bVar3) goto LAB_0011cb14;
        uVar18 = uVar18 >> 8 & 0xf;
        unaff_R13 = (ulong)uVar18;
        if (uVar18 < 4) {
          if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks[unaff_R13] >> (bVar3 & 0x1f)
              & 1) != 0) {
            pcStack_60 = (code *)0x11cac4;
            EVar10 = onSaveReg(this,uVar18,uVar11,(uint)bVar3);
            if (EVar10 != 0) {
              return EVar10;
            }
          }
          pcStack_60 = (code *)0x11cada;
          this_00 = local_50;
          RAAssignment::unassign((RAAssignment *)local_50,uVar18,uVar11,(uint)bVar3);
          pvVar15 = local_40;
          node_01 = local_48;
          goto LAB_0011cae4;
        }
        goto LAB_0011cb19;
      }
LAB_0011cae4:
      pIVar19 = (InstNode *)((long)&(pIVar19->super_BaseNode).field_0 + 1);
      lVar16 = lVar16 + 0x18;
    } while (node_01 != pIVar19);
  }
  return 0;
}

Assistant:

Error RALocalAllocator::spillAfterAllocation(InstNode* node) noexcept {
  // This is experimental feature that would spill registers that don't have
  // home-id and are last in this basic block. This prevents saving these regs
  // in other basic blocks and then restoring them (mostly relevant for loops).
  RAInst* raInst = node->passData<RAInst>();
  uint32_t count = raInst->tiedCount();

  for (uint32_t i = 0; i < count; i++) {
    RATiedReg* tiedReg = raInst->tiedAt(i);
    if (tiedReg->isLast()) {
      uint32_t workId = tiedReg->workId();
      RAWorkReg* workReg = workRegById(workId);
      if (!workReg->hasHomeRegId()) {
        uint32_t group = workReg->group();
        uint32_t assignedId = _curAssignment.workToPhysId(group, workId);
        if (assignedId != RAAssignment::kPhysNone) {
          _cc->_setCursor(node);
          ASMJIT_PROPAGATE(onSpillReg(group, workId, assignedId));
        }
      }
    }
  }

  return kErrorOk;
}